

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

bool __thiscall
slang::ast::ConditionalExpression::propagateType
          (ConditionalExpression *this,ASTContext *context,Type *newType,SourceRange opRange,
          ConversionKind conversionKind)

{
  optional<unsigned_int> otherEffectiveWidth;
  optional<unsigned_int> otherEffectiveWidth_00;
  bitmask<slang::ast::ASTFlags> flags;
  bitmask<slang::ast::ASTFlags> flags_00;
  bool parentTypeEquiv;
  anon_class_48_6_9004a454 handleBranch;
  bool local_75;
  ConversionKind local_74;
  SourceRange local_70;
  anon_class_48_6_9004a454 local_60;
  
  local_70.endLoc = opRange.endLoc;
  local_70.startLoc = opRange.startLoc;
  local_74 = conversionKind;
  local_75 = Type::isEquivalent((this->super_Expression).type.ptr,newType);
  local_60.parentTypeEquiv = &local_75;
  (this->super_Expression).type.ptr = newType;
  flags.m_bits._4_4_ = 0;
  flags.m_bits._0_4_ = (uint)(byte)(this->isTrue & this->isConst) * 2;
  flags_00.m_bits = 0;
  if (this->isConst != false) {
    flags_00.m_bits = (ulong)(((byte)~this->isTrue & 1) * 2);
  }
  local_60.conversionKind = &local_74;
  local_60.opRange = &local_70;
  local_60.newType = newType;
  local_60.context = context;
  local_60.this = this;
  otherEffectiveWidth = Expression::getEffectiveWidth(this->left_);
  otherEffectiveWidth_00 = Expression::getEffectiveWidth(this->right_);
  propagateType::anon_class_48_6_9004a454::operator()
            (&local_60,&this->left_,flags_00,otherEffectiveWidth_00);
  propagateType::anon_class_48_6_9004a454::operator()
            (&local_60,&this->right_,flags,otherEffectiveWidth);
  return true;
}

Assistant:

bool ConditionalExpression::propagateType(const ASTContext& context, const Type& newType,
                                          SourceRange opRange, ConversionKind conversionKind) {
    const bool parentTypeEquiv = type->isEquivalent(newType);
    type = &newType;

    bitmask<ASTFlags> leftFlags = ASTFlags::None;
    bitmask<ASTFlags> rightFlags = ASTFlags::None;
    if (isConst) {
        if (isTrue)
            rightFlags = ASTFlags::UnevaluatedBranch;
        else
            leftFlags = ASTFlags::UnevaluatedBranch;
    }

    auto handleBranch = [&](Expression*& expr, bitmask<ASTFlags> flags,
                            std::optional<bitwidth_t> otherEffectiveWidth) {
        // This is a propagated conversion but we'd like to see width-expand
        // warnings anyway so we'll manually do the check conversion check here.
        if (!flags.has(ASTFlags::UnevaluatedBranch) &&
            conversionKind <= ConversionKind::Propagated) {
            // If the parent type was already equivalent to what's being propagated,
            // then the only conversions we might be doing are "self induced", in the
            // sense that one branch is propagating its type to the other side.
            // We want to avoid warning in those cases where we have a literal
            // expression with a smaller effective type, like for example:
            //   bit a, b, c;
            //   c = a ? b : 0; // 32-bit literal 0 shouldn't cause a warning
            if (!parentTypeEquiv || !newType.isNumeric() || !expr->type->isNumeric() ||
                !otherEffectiveWidth || expr->type->getBitWidth() < otherEffectiveWidth) {
                ConversionExpression::checkImplicitConversions(context, *expr->type, newType, *expr,
                                                               this, opRange,
                                                               ConversionKind::Implicit);
            }
        }

        contextDetermined(context.resetFlags(flags), expr, this, newType, opRange);
    };

    auto leftEffectiveWidth = left().getEffectiveWidth();
    auto rightEffectiveWidth = right().getEffectiveWidth();
    handleBranch(left_, leftFlags, rightEffectiveWidth);
    handleBranch(right_, rightFlags, leftEffectiveWidth);

    // The predicate is self determined so no need to handle it here.
    return true;
}